

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void Cmd_dump3df(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  extsector_t *peVar2;
  F3DFloor *pFVar3;
  sector_t *psVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  uint i;
  ulong uVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  
  iVar5 = FCommandLine::argc(argv);
  if (1 < iVar5) {
    pcVar6 = FCommandLine::operator[](argv,1);
    lVar7 = strtol(pcVar6,(char **)0x0,10);
    psVar4 = sectors + (int)lVar7;
    peVar2 = sectors[(int)lVar7].e;
    for (uVar8 = 0; uVar8 < (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        uVar8 = uVar8 + 1) {
      dVar10 = secplane_t::ZatPoint
                         (((peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                           [uVar8]->top).plane,&psVar4->centerspot);
      dVar11 = secplane_t::ZatPoint
                         (((peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                           [uVar8]->bottom).plane,&psVar4->centerspot);
      pFVar3 = (peVar2->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar8];
      uVar1 = pFVar3->flags;
      pcVar6 = "Exists";
      if ((uVar1 & 1) == 0) {
        pcVar6 = "";
      }
      pcVar9 = "Dynamic";
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar9 = "";
      }
      Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n"
             ,dVar10,SUB84(dVar11,0),uVar8 & 0xffffffff,
             (ulong)(uint)((pFVar3->top).model)->sectornum,
             (ulong)(uint)((pFVar3->bottom).model)->sectornum,(ulong)uVar1,
             (ulong)(uint)pFVar3->alpha,pcVar6,pcVar9);
    }
  }
  return;
}

Assistant:

CCMD (dump3df)
{
	if (argv.argc() > 1) 
	{
		int sec = strtol(argv[1], NULL, 10);
		sector_t *sector = &sectors[sec];
		TArray<F3DFloor*> & ffloors=sector->e->XFloor.ffloors;

		for (unsigned int i = 0; i < ffloors.Size(); i++)
		{
			double height=ffloors[i]->top.plane->ZatPoint(sector->centerspot);
			double bheight=ffloors[i]->bottom.plane->ZatPoint(sector->centerspot);

			IGNORE_FORMAT_PRE
			Printf("FFloor %d @ top = %f (model = %d), bottom = %f (model = %d), flags = %B, alpha = %d %s %s\n", 
				i, height, ffloors[i]->top.model->sectornum, 
				bheight, ffloors[i]->bottom.model->sectornum,
				ffloors[i]->flags, ffloors[i]->alpha, (ffloors[i]->flags&FF_EXISTS)? "Exists":"", (ffloors[i]->flags&FF_DYNAMIC)? "Dynamic":"");
			IGNORE_FORMAT_POST
		}
	}
}